

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee754.h
# Opt level: O1

double __thiscall rapidjson::internal::Double::NextPositiveDouble(Double *this)

{
  RapidJSONException *this_00;
  
  if (-1 < (long)(this->field_0).u_) {
    return (double)((this->field_0).u_ + 1);
  }
  this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
  cereal::RapidJSONException::RapidJSONException
            (this_00,"rapidjson internal assertion failure: !Sign()");
  __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Sign() const { return (u_ & kSignMask) != 0; }